

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_coin.cpp
# Opt level: O2

void __thiscall cfd::core::BlockHash::BlockHash(BlockHash *this,string *hex)

{
  CfdException *this_00;
  unsigned_long local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> reverse_buffer;
  undefined1 local_68 [32];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_30;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_28;
  
  this->_vptr_BlockHash = (_func_int **)&PTR__BlockHash_005b4050;
  ByteData::ByteData(&this->data_);
  StringUtil::StringToByte
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,(string *)hex);
  local_28.current._M_current =
       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        )(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          )local_48._M_impl.super__Vector_impl_data._M_finish;
  local_30.current._M_current =
       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        )(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          )local_48._M_impl.super__Vector_impl_data._M_start;
  ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&reverse_buffer,&local_28,
             &local_30,(allocator_type *)local_68);
  local_88 = (long)reverse_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)reverse_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  if (local_88 == 0x20) {
    ByteData::ByteData((ByteData *)local_68,&reverse_buffer);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&(this->data_).data_,
               (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_68);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&reverse_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
    return;
  }
  local_68._0_8_ = "cfdcore_coin.cpp";
  local_68._8_4_ = 0x4f;
  local_68._16_8_ = "BlockHash";
  logger::warn<unsigned_long>
            ((CfdSourceLocation *)local_68,"BlockHash size Invalid. size={}.",&local_88);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)local_68,"BlockHash size Invalid.",(allocator *)&local_88);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_68);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

BlockHash::BlockHash(const std::string& hex) : data_() {
  const std::vector<uint8_t>& data = StringUtil::StringToByte(hex);
  std::vector<uint8_t> reverse_buffer(data.crbegin(), data.crend());
  if (reverse_buffer.size() != kByteData256Length) {
    warn(
        CFD_LOG_SOURCE, "BlockHash size Invalid. size={}.",
        reverse_buffer.size());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "BlockHash size Invalid.");
  }
  data_ = ByteData(reverse_buffer);
}